

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O1

double __thiscall ON_NurbsCage::Knot(ON_NurbsCage *this,int dir,int knot_index)

{
  if ((uint)dir < 3) {
    if ((-1 < knot_index && this->m_knot[(uint)dir] != (double *)0x0) &&
       (knot_index < this->m_cv_count[(uint)dir] + this->m_order[(uint)dir] + -2)) {
      return this->m_knot[(uint)dir][(uint)knot_index];
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbsvolume.cpp"
             ,0x708,"","ON_NurbsCage::Knot - invalid input parameters");
  return -1.23432101234321e+308;
}

Assistant:

double ON_NurbsCage::Knot(
      int dir,
      int knot_index
      ) const
{
  double knot_value;

  // Validate input so invalid input does not crash Rhino.
  // Expert programmers who want to write fast code can directly
  // access the m_knot[] arrays.
  if (    dir >= 0 && dir < 3 
       && 0 != m_knot[dir]
       && knot_index >= 0 
       && knot_index < m_order[dir]+m_cv_count[dir]-2
     )
  {
    knot_value = m_knot[dir][knot_index];
  }
  else
  {
    ON_ERROR("ON_NurbsCage::Knot - invalid input parameters");
    knot_value = ON_UNSET_VALUE;
  }
  return knot_value;
}